

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QString * __thiscall QTzTimeZonePrivate::comment(QTzTimeZonePrivate *this)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *key;
  QHash<QByteArray,_QTzTimeZone> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
             0x74c663);
  QHash<QByteArray,_QTzTimeZone>::value(in_stack_ffffffffffffffb8,(QByteArray *)key);
  QString::fromUtf8<void>((QByteArray *)in_RDI);
  QTzTimeZone::~QTzTimeZone((QTzTimeZone *)0x74c694);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::comment() const
{
    return QString::fromUtf8(tzZones->value(m_id).comment);
}